

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void snap_restoredata(GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref,void *dst,
                     CTSize sz)

{
  uint uVar1;
  ulong in_RCX;
  SnapNo in_EDX;
  GCtrace *in_RSI;
  GCtrace *in_RDI;
  uint in_R8D;
  IRIns *in_R9;
  CTSize unaff_retaddr;
  int in_stack_00000008;
  Reg r;
  uint64_t tmp;
  int32_t *src;
  RegSP rs;
  IRIns *ir;
  IRIns local_50;
  IRIns *local_48;
  uint local_3c;
  IRIns *dst_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_48 = in_RDI->ir + in_R8D;
  local_3c = (uint)(local_48->field_0).prev;
  if (in_R8D < 0x8000) {
    if (((local_48->field_1).o == '\x1b') || ((local_48->field_1).o == '\x1c')) {
      local_48 = (IRIns *)(ulong)(local_48->field_1).op12;
    }
    else if (in_stack_00000008 == 8) {
      local_48 = &local_50;
    }
  }
  else {
    dst_00 = local_48;
    if ((in_RCX & 1L << ((byte)in_R8D & 0x3f)) != 0) {
      local_3c = snap_renameref(in_RDI,in_EDX,in_R8D,local_3c);
      dst_00 = local_48;
    }
    if (local_3c >> 8 == 0) {
      uVar1 = local_3c & 0xff;
      if ((local_3c & 0x80) != 0) {
        snap_restoredata(in_RSI,(ExitState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                         (SnapNo)(in_RCX >> 0x20),CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                         (IRRef)((ulong)in_R9 >> 0x20),dst_00,unaff_retaddr);
        *in_R9 = (IRIns)(double)in_R9->i;
        return;
      }
      local_48 = (IRIns *)(&in_RSI[1].snap + uVar1);
      if (0xf < uVar1) {
        local_48 = (IRIns *)(&in_RSI->nextgc + (ulong)(uVar1 - 0x10) * 2);
      }
    }
    else {
      local_48 = (IRIns *)((long)&in_RSI[2].mcode + (ulong)(local_3c >> 8) * 4);
      if ((in_stack_00000008 == 8) && ((0x604208U >> ((dst_00->field_1).t.irt & 0x1f) & 1) == 0)) {
        local_48 = &local_50;
      }
    }
  }
  if (in_stack_00000008 == 4) {
    (in_R9->field_1).op12 = (local_48->field_1).op12;
  }
  else if (in_stack_00000008 == 8) {
    in_R9->field_1 = *(anon_struct_8_5_4e98db7e_for_IRIns_2 *)local_48;
  }
  else if (in_stack_00000008 == 1) {
    *(char *)in_R9 = (char)(local_48->field_1).op12;
  }
  else {
    (in_R9->field_0).op1 = (IRRef1)(local_48->field_1).op12;
  }
  return;
}

Assistant:

static void snap_restoredata(GCtrace *T, ExitState *ex,
			     SnapNo snapno, BloomFilter rfilt,
			     IRRef ref, void *dst, CTSize sz)
{
  IRIns *ir = &T->ir[ref];
  RegSP rs = ir->prev;
  int32_t *src;
  uint64_t tmp;
  if (irref_isk(ref)) {
    if (ir->o == IR_KNUM || ir->o == IR_KINT64) {
      src = mref(ir->ptr, int32_t);
    } else if (sz == 8) {
      tmp = (uint64_t)(uint32_t)ir->i;
      src = (int32_t *)&tmp;
    } else {
      src = &ir->i;
    }
  } else {
    if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
      rs = snap_renameref(T, snapno, ref, rs);
    if (ra_hasspill(regsp_spill(rs))) {
      src = &ex->spill[regsp_spill(rs)];
      if (sz == 8 && !irt_is64(ir->t)) {
	tmp = (uint64_t)(uint32_t)*src;
	src = (int32_t *)&tmp;
      }
    } else {
      Reg r = regsp_reg(rs);
      if (ra_noreg(r)) {
	/* Note: this assumes CNEWI is never used for SOFTFP split numbers. */
	lua_assert(sz == 8 && ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
	snap_restoredata(T, ex, snapno, rfilt, ir->op1, dst, 4);
	*(lua_Number *)dst = (lua_Number)*(int32_t *)dst;
	return;
      }
      src = (int32_t *)&ex->gpr[r-RID_MIN_GPR];
#if !LJ_SOFTFP
      if (r >= RID_MAX_GPR) {
	src = (int32_t *)&ex->fpr[r-RID_MIN_FPR];
#if LJ_TARGET_PPC
	if (sz == 4) {  /* PPC FPRs are always doubles. */
	  *(float *)dst = (float)*(double *)src;
	  return;
	}
#else
	if (LJ_BE && sz == 4) src++;
#endif
      }
#endif
    }
  }
  lua_assert(sz == 1 || sz == 2 || sz == 4 || sz == 8);
  if (sz == 4) *(int32_t *)dst = *src;
  else if (sz == 8) *(int64_t *)dst = *(int64_t *)src;
  else if (sz == 1) *(int8_t *)dst = (int8_t)*src;
  else *(int16_t *)dst = (int16_t)*src;
}